

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O0

t_int * voutlet_doepilog_resampling(t_int *w)

{
  long lVar1;
  t_sample *local_30;
  t_sample *out;
  t_sample *in;
  int n;
  t_voutlet *x;
  t_int *w_local;
  
  lVar1 = w[1];
  out = *(t_sample **)(lVar1 + 0x58);
  local_30 = *(t_sample **)(lVar1 + 0x90);
  in._4_4_ = (int)w[2];
  while (in._4_4_ != 0) {
    *local_30 = *out;
    *out = 0.0;
    out = out + 1;
    local_30 = local_30 + 1;
    in._4_4_ = in._4_4_ + -1;
  }
  if (out == *(t_sample **)(lVar1 + 0x50)) {
    out = *(t_sample **)(lVar1 + 0x48);
  }
  *(t_sample **)(lVar1 + 0x58) = out;
  return w + 3;
}

Assistant:

static t_int *voutlet_doepilog_resampling(t_int *w)
{
    t_voutlet *x = (t_voutlet *)(w[1]);
    int n = (int)(w[2]);
    t_sample *in  = x->x_empty;
    t_sample *out = x->x_updown.s_vec;
    for (; n--; in++) *out++ = *in, *in = 0;
    if (in == x->x_endbuf) in = x->x_buf;
    x->x_empty = in;
    return (w+3);
}